

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O1

void __thiscall FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym(NoRelatedSym *this)

{
  long *plVar1;
  atomic<long> *counter;
  message_order local_30 [8];
  undefined8 local_28;
  long *plStack_20;
  
  FIX::message_order::message_order
            (local_30,0x37,0x41,0x30,0x16,0xa7,200,0xcd,0xc9,0xca,0xce,0xe7,0xdf,0xcf,0x6a,0x15c,
             0x15d,0x6b,0x15e,0x15f,0x150,0);
  FIX::FieldMap::FieldMap((FieldMap *)this,local_30);
  plVar1 = plStack_20;
  *(undefined ***)&this->super_Group = &PTR__FieldMap_0015b7e8;
  (this->super_Group).m_field = 0x92;
  (this->super_Group).m_delim = 0x37;
  if (plStack_20 != (long *)0x0) {
    LOCK();
    *plStack_20 = *plStack_20 + -1;
    UNLOCK();
    if (*plStack_20 == 0) {
      local_28 = 0;
      plStack_20 = (long *)0x0;
      if (plVar1 != (long *)0x0) {
        operator_delete__(plVar1);
      }
    }
  }
  *(undefined ***)&this->super_Group = &PTR__FieldMap_0015b798;
  return;
}

Assistant:

NoRelatedSym() : FIX::Group(146,55,FIX::message_order(55,65,48,22,167,200,205,201,202,206,231,223,207,106,348,349,107,350,351,336,0)) {}